

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__,
                IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  pointer pTVar1;
  pointer ppVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  TestCase *testCase;
  pointer pTVar7;
  long lVar8;
  pointer ppVar9;
  size_type sVar10;
  __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
  __i;
  pointer ppVar11;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  indexed_tests;
  uint local_5c;
  _Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  local_58;
  vector<Catch::TestCase,std::allocator<Catch::TestCase>> *local_40;
  pointer local_38;
  
  iVar3 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x11])(config);
  if (iVar3 == 2) {
    seedRng(config);
    uVar4 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x12])(config);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clara::std::
    vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ::reserve((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
               *)&local_58,
              ((long)(unsortedTestCases->
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_start) / 0xb8);
    pTVar1 = (unsortedTestCases->
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_40 = (vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__;
    for (pTVar7 = (unsortedTestCases->
                  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        __return_storage_ptr__ =
             (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_40,
        ppVar9 = local_58._M_impl.super__Vector_impl_data._M_finish,
        ppVar2 = local_58._M_impl.super__Vector_impl_data._M_start, pTVar7 != pTVar1;
        pTVar7 = pTVar7 + 1) {
      uVar5 = 0xcbf29ce484222325;
      for (sVar10 = 0; (pTVar7->super_TestCaseInfo).name._M_string_length != sVar10;
          sVar10 = sVar10 + 1) {
        uVar5 = (uVar5 ^ (long)(pTVar7->super_TestCaseInfo).name._M_dataplus._M_p[sVar10]) *
                0x100000001b3;
      }
      lVar6 = (uVar5 ^ uVar4) * 0x100000001b3;
      local_5c = (int)((ulong)lVar6 >> 0x20) * (int)lVar6;
      local_38 = pTVar7;
      std::
      vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
      ::emplace_back<unsigned_int,Catch::TestCase_const*>
                ((vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
                  *)&local_58,&local_5c,&local_38);
    }
    if (local_58._M_impl.super__Vector_impl_data._M_start !=
        local_58._M_impl.super__Vector_impl_data._M_finish) {
      lVar8 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58._M_impl.super__Vector_impl_data._M_start;
      uVar5 = lVar8 >> 4;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                (local_58._M_impl.super__Vector_impl_data._M_start,
                 local_58._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e)
      ;
      if (lVar8 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                  (ppVar2,ppVar9);
      }
      else {
        ppVar11 = ppVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                  (ppVar2,ppVar11);
        for (; ppVar11 != ppVar9; ppVar11 = ppVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                    (ppVar11);
        }
      }
    }
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0;
    *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0;
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
              (__return_storage_ptr__,
               (long)local_58._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4);
    ppVar2 = local_58._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar9 = local_58._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2;
        ppVar9 = ppVar9 + 1) {
      std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>::
      emplace_back<Catch::TestCase_const&>
                ((vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__,
                 ppVar9->second);
    }
    clara::std::
    _Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ::~_Vector_base(&local_58);
  }
  else if (iVar3 == 1) {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    std::
    __sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
         (vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__;
}

Assistant:

std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {
        switch( config.runOrder() ) {
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;

            case RunTests::InLexicographicalOrder: {
                std::vector<TestCase> sorted = unsortedTestCases;
                std::sort( sorted.begin(), sorted.end() );
                return sorted;
            }

            case RunTests::InRandomOrder: {
                seedRng( config );
                TestHasher h{ config.rngSeed() };

                using hashedTest = std::pair<TestHasher::hash_t, TestCase const*>;
                std::vector<hashedTest> indexed_tests;
                indexed_tests.reserve( unsortedTestCases.size() );

                for (auto const& testCase : unsortedTestCases) {
                    indexed_tests.emplace_back(h(testCase), &testCase);
                }

                std::sort(indexed_tests.begin(), indexed_tests.end(),
                          [](hashedTest const& lhs, hashedTest const& rhs) {
                          if (lhs.first == rhs.first) {
                              return lhs.second->name < rhs.second->name;
                          }
                          return lhs.first < rhs.first;
                });

                std::vector<TestCase> sorted;
                sorted.reserve( indexed_tests.size() );

                for (auto const& hashed : indexed_tests) {
                    sorted.emplace_back(*hashed.second);
                }

                return sorted;
            }
        }
        return unsortedTestCases;
    }